

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInputSource.cc
# Opt level: O0

ssize_t __thiscall FileInputSource::read(FileInputSource *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  qpdf_offset_t qVar2;
  QPDFExc *this_00;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  string local_e8;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  allocator<char> local_49;
  string local_48;
  size_t local_28;
  size_t len;
  size_t length_local;
  char *buffer_local;
  FileInputSource *this_local;
  
  length_local = CONCAT44(in_register_00000034,__fd);
  len = (size_t)__buf;
  buffer_local = (char *)this;
  qVar2 = QUtil::tell(this->file);
  (this->super_InputSource).last_offset = qVar2;
  local_28 = fread((void *)length_local,1,len,(FILE *)this->file);
  if (local_28 == 0) {
    iVar1 = ferror((FILE *)this->file);
    if (iVar1 != 0) {
      this_00 = (QPDFExc *)__cxa_allocate_exception(0x80);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_49);
      qVar2 = (this->super_InputSource).last_offset;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"read ",&local_c1);
      std::__cxx11::to_string(&local_e8,len);
      std::operator+(&local_a0,&local_c0,&local_e8);
      std::operator+(&local_80,&local_a0," bytes");
      QPDFExc::QPDFExc(this_00,qpdf_e_system,&this->filename,&local_48,qVar2,&local_80);
      __cxa_throw(this_00,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    if (len != 0) {
      (*(this->super_InputSource)._vptr_InputSource[5])(this,0,2);
      iVar1 = (*(this->super_InputSource)._vptr_InputSource[4])();
      (this->super_InputSource).last_offset = CONCAT44(extraout_var,iVar1);
    }
  }
  return local_28;
}

Assistant:

size_t
FileInputSource::read(char* buffer, size_t length)
{
    this->last_offset = QUtil::tell(this->file);
    size_t len = fread(buffer, 1, length, this->file);
    if (len == 0) {
        if (ferror(this->file)) {
            throw QPDFExc(
                qpdf_e_system,
                this->filename,
                "",
                this->last_offset,
                (std::string("read ") + std::to_string(length) + " bytes"));
        } else if (length > 0) {
            this->seek(0, SEEK_END);
            this->last_offset = this->tell();
        }
    }
    return len;
}